

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_swap_hierarchy(Tree *this,size_t ia,size_t ib)

{
  size_t sVar1;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  size_t in_RDX;
  size_t in_RSI;
  long in_RDI;
  bool bVar5;
  char msg_9 [39];
  char msg_8 [39];
  char msg_7 [39];
  char msg_6 [39];
  size_t ns_1;
  char msg_5 [39];
  char msg_4 [39];
  char msg_3 [39];
  size_t ns;
  char msg_2 [39];
  char msg_1 [39];
  char msg [39];
  bool changed;
  NodeData *pb;
  NodeData *pa;
  NodeData *b;
  NodeData *a;
  size_t i_1;
  size_t i;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  char *in_stack_fffffffffffffb48;
  Location *in_stack_fffffffffffffb50;
  size_t in_stack_fffffffffffffb78;
  undefined1 *puVar6;
  Tree *in_stack_fffffffffffffb80;
  code *pcVar7;
  undefined1 local_378 [48];
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined4 local_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  char *local_330;
  undefined1 local_328 [48];
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  char *local_2e0;
  undefined1 local_2d8 [48];
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  char *local_290;
  undefined1 local_288 [48];
  char *local_258;
  undefined4 local_250;
  size_t local_248;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  char *local_220;
  undefined1 local_218 [48];
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  char *local_1d0;
  undefined1 local_1c8 [48];
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  char *local_180;
  undefined1 local_178 [48];
  size_t local_148;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  char *local_120;
  undefined1 local_118 [48];
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  char *local_d0;
  undefined1 local_c8 [48];
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  char *local_80;
  undefined1 local_78 [47];
  bool local_49;
  NodeData *local_48;
  NodeData *local_40;
  NodeData *local_38;
  NodeData *local_30;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  size_t local_10;
  
  if (in_RSI != in_RDX) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_20 = first_child((Tree *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    while (sVar1 = local_18, local_20 != 0xffffffffffffffff) {
      if ((local_20 != local_18) && (local_20 != local_10)) {
        pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        pNVar4->m_parent = sVar1;
      }
      local_20 = next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    }
    local_28 = first_child((Tree *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    while (sVar1 = local_10, local_28 != 0xffffffffffffffff) {
      if ((local_28 != local_18) && (local_28 != local_10)) {
        pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        pNVar4->m_parent = sVar1;
      }
      local_28 = next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                              CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    }
    local_30 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_38 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_40 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_48 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    if (local_40 == local_48) {
      if (((local_40->m_first_child == local_18) && (local_40->m_last_child == local_10)) ||
         ((local_40->m_first_child == local_10 && (local_40->m_last_child == local_18)))) {
        std::swap<unsigned_long>(&local_40->m_first_child,&local_40->m_last_child);
      }
      else {
        bVar2 = local_40->m_first_child == local_10;
        if (bVar2) {
          local_40->m_first_child = local_18;
        }
        bVar5 = local_40->m_last_child == local_10;
        if (bVar5) {
          local_40->m_last_child = local_18;
        }
        local_49 = bVar5 || bVar2;
        if ((local_48->m_first_child == local_18) && (!bVar5 && !bVar2)) {
          local_48->m_first_child = local_10;
        }
        if ((local_48->m_last_child == local_18) && (!bVar5 && !bVar2)) {
          local_48->m_last_child = local_10;
        }
      }
    }
    else {
      if (local_40->m_first_child == local_10) {
        local_40->m_first_child = local_18;
      }
      if (local_40->m_last_child == local_10) {
        local_40->m_last_child = local_18;
      }
      if (local_48->m_first_child == local_18) {
        local_48->m_first_child = local_10;
      }
      if (local_48->m_last_child == local_18) {
        local_48->m_last_child = local_10;
      }
    }
    std::swap<unsigned_long>(&local_30->m_first_child,&local_38->m_first_child);
    std::swap<unsigned_long>(&local_30->m_last_child,&local_38->m_last_child);
    sVar1 = local_18;
    if ((((local_30->m_prev_sibling == local_18) || (local_38->m_prev_sibling == local_10)) ||
        (local_30->m_next_sibling == local_18)) || (local_38->m_next_sibling == local_10)) {
      if (local_30->m_next_sibling == local_18) {
        if (local_38->m_prev_sibling != local_10) {
          memcpy(local_78,"check failed: (b.m_prev_sibling == ia)",0x27);
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          pcVar7 = *(code **)(in_RDI + 0x58);
          Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
          (*pcVar7)(local_78,0x27,*(undefined8 *)(in_RDI + 0x40));
          in_stack_fffffffffffffb30 = uStack_98;
          in_stack_fffffffffffffb34 = uStack_94;
          in_stack_fffffffffffffb38 = local_90;
          in_stack_fffffffffffffb3c = uStack_8c;
          in_stack_fffffffffffffb40 = uStack_88;
          in_stack_fffffffffffffb44 = uStack_84;
          in_stack_fffffffffffffb48 = local_80;
        }
        if (local_30->m_prev_sibling != 0xffffffffffffffff) {
          if (local_30->m_prev_sibling == local_18) {
            memcpy(local_c8,"check failed: (a.m_prev_sibling != ib)",0x27);
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            pcVar7 = *(code **)(in_RDI + 0x58);
            Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
            (*pcVar7)(local_c8,0x27,*(undefined8 *)(in_RDI + 0x40));
            in_stack_fffffffffffffb30 = uStack_e8;
            in_stack_fffffffffffffb34 = uStack_e4;
            in_stack_fffffffffffffb38 = local_e0;
            in_stack_fffffffffffffb3c = uStack_dc;
            in_stack_fffffffffffffb40 = uStack_d8;
            in_stack_fffffffffffffb44 = uStack_d4;
            in_stack_fffffffffffffb48 = local_d0;
          }
          sVar1 = local_18;
          pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          pNVar4->m_next_sibling = sVar1;
        }
        if (local_38->m_next_sibling != 0xffffffffffffffff) {
          if (local_38->m_next_sibling == local_10) {
            memcpy(local_118,"check failed: (b.m_next_sibling != ia)",0x27);
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            pcVar7 = *(code **)(in_RDI + 0x58);
            Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
            (*pcVar7)(local_118,0x27,*(undefined8 *)(in_RDI + 0x40));
            in_stack_fffffffffffffb30 = uStack_138;
            in_stack_fffffffffffffb34 = uStack_134;
            in_stack_fffffffffffffb38 = local_130;
            in_stack_fffffffffffffb3c = uStack_12c;
            in_stack_fffffffffffffb40 = uStack_128;
            in_stack_fffffffffffffb44 = uStack_124;
            in_stack_fffffffffffffb48 = local_120;
          }
          sVar1 = local_10;
          pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          pNVar4->m_prev_sibling = sVar1;
        }
        local_148 = local_38->m_next_sibling;
        local_38->m_prev_sibling = local_30->m_prev_sibling;
        local_38->m_next_sibling = local_10;
        local_30->m_prev_sibling = local_18;
        local_30->m_next_sibling = local_148;
      }
      else if (local_30->m_prev_sibling == local_18) {
        if (local_38->m_next_sibling != local_10) {
          memcpy(local_178,"check failed: (b.m_next_sibling == ia)",0x27);
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          pcVar7 = *(code **)(in_RDI + 0x58);
          Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                             CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
          (*pcVar7)(local_178,0x27,*(undefined8 *)(in_RDI + 0x40));
          in_stack_fffffffffffffb30 = uStack_198;
          in_stack_fffffffffffffb34 = uStack_194;
          in_stack_fffffffffffffb38 = local_190;
          in_stack_fffffffffffffb3c = uStack_18c;
          in_stack_fffffffffffffb40 = uStack_188;
          in_stack_fffffffffffffb44 = uStack_184;
          in_stack_fffffffffffffb48 = local_180;
        }
        if (local_38->m_prev_sibling != 0xffffffffffffffff) {
          if (local_38->m_prev_sibling == local_10) {
            memcpy(local_1c8,"check failed: (b.m_prev_sibling != ia)",0x27);
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            pcVar7 = *(code **)(in_RDI + 0x58);
            Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
            (*pcVar7)(local_1c8,0x27,*(undefined8 *)(in_RDI + 0x40));
            in_stack_fffffffffffffb30 = uStack_1e8;
            in_stack_fffffffffffffb34 = uStack_1e4;
            in_stack_fffffffffffffb38 = local_1e0;
            in_stack_fffffffffffffb3c = uStack_1dc;
            in_stack_fffffffffffffb40 = uStack_1d8;
            in_stack_fffffffffffffb44 = uStack_1d4;
            in_stack_fffffffffffffb48 = local_1d0;
          }
          sVar1 = local_10;
          pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          pNVar4->m_next_sibling = sVar1;
        }
        if (local_30->m_next_sibling != 0xffffffffffffffff) {
          if (local_30->m_next_sibling == local_18) {
            memcpy(local_218,"check failed: (a.m_next_sibling != ib)",0x27);
            eVar3 = get_error_flags();
            if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            pcVar7 = *(code **)(in_RDI + 0x58);
            Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                               CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                               CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                               CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
            (*pcVar7)(local_218,0x27,*(undefined8 *)(in_RDI + 0x40));
            in_stack_fffffffffffffb30 = uStack_238;
            in_stack_fffffffffffffb34 = uStack_234;
            in_stack_fffffffffffffb38 = local_230;
            in_stack_fffffffffffffb3c = uStack_22c;
            in_stack_fffffffffffffb40 = uStack_228;
            in_stack_fffffffffffffb44 = uStack_224;
            in_stack_fffffffffffffb48 = local_220;
          }
          sVar1 = local_18;
          pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
          pNVar4->m_prev_sibling = sVar1;
        }
        local_248 = local_38->m_prev_sibling;
        local_30->m_prev_sibling = local_38->m_prev_sibling;
        local_30->m_next_sibling = local_18;
        local_38->m_prev_sibling = local_10;
        local_38->m_next_sibling = local_248;
      }
      else {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        local_258 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_250 = 0x64e3;
        handle_error(0x345f1b,(char *)0x64e3,"never reach this point");
      }
    }
    else {
      if ((local_30->m_prev_sibling != 0xffffffffffffffff) && (local_30->m_prev_sibling != local_18)
         ) {
        pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        pNVar4->m_next_sibling = sVar1;
      }
      sVar1 = local_18;
      if ((local_30->m_next_sibling != 0xffffffffffffffff) && (local_30->m_next_sibling != local_18)
         ) {
        pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        pNVar4->m_prev_sibling = sVar1;
      }
      sVar1 = local_10;
      if ((local_38->m_prev_sibling != 0xffffffffffffffff) && (local_38->m_prev_sibling != local_10)
         ) {
        pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        pNVar4->m_next_sibling = sVar1;
      }
      sVar1 = local_10;
      if ((local_38->m_next_sibling != 0xffffffffffffffff) && (local_38->m_next_sibling != local_10)
         ) {
        pNVar4 = _p(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        pNVar4->m_prev_sibling = sVar1;
      }
      std::swap<unsigned_long>(&local_30->m_prev_sibling,&local_38->m_prev_sibling);
      std::swap<unsigned_long>(&local_30->m_next_sibling,&local_38->m_next_sibling);
    }
    if (local_30->m_next_sibling == local_10) {
      memcpy(local_288,"check failed: (a.m_next_sibling != ia)",0x27);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar7 = *(code **)(in_RDI + 0x58);
      Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      (*pcVar7)(local_288,0x27,*(undefined8 *)(in_RDI + 0x40));
      in_stack_fffffffffffffb30 = uStack_2a8;
      in_stack_fffffffffffffb34 = uStack_2a4;
      in_stack_fffffffffffffb38 = local_2a0;
      in_stack_fffffffffffffb3c = uStack_29c;
      in_stack_fffffffffffffb40 = uStack_298;
      in_stack_fffffffffffffb44 = uStack_294;
      in_stack_fffffffffffffb48 = local_290;
    }
    if (local_30->m_prev_sibling == local_10) {
      memcpy(local_2d8,"check failed: (a.m_prev_sibling != ia)",0x27);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar7 = *(code **)(in_RDI + 0x58);
      puVar6 = local_2d8;
      Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      (*pcVar7)(puVar6,0x27,*(undefined8 *)(in_RDI + 0x40));
      in_stack_fffffffffffffb30 = uStack_2f8;
      in_stack_fffffffffffffb34 = uStack_2f4;
      in_stack_fffffffffffffb38 = local_2f0;
      in_stack_fffffffffffffb3c = uStack_2ec;
      in_stack_fffffffffffffb40 = uStack_2e8;
      in_stack_fffffffffffffb44 = uStack_2e4;
      in_stack_fffffffffffffb48 = local_2e0;
    }
    if (local_38->m_next_sibling == local_18) {
      memcpy(local_328,"check failed: (b.m_next_sibling != ib)",0x27);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar7 = *(code **)(in_RDI + 0x58);
      Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      (*pcVar7)(local_328,0x27,*(undefined8 *)(in_RDI + 0x40));
      in_stack_fffffffffffffb30 = uStack_348;
      in_stack_fffffffffffffb34 = uStack_344;
      in_stack_fffffffffffffb38 = local_340;
      in_stack_fffffffffffffb3c = uStack_33c;
      in_stack_fffffffffffffb40 = uStack_338;
      in_stack_fffffffffffffb44 = uStack_334;
      in_stack_fffffffffffffb48 = local_330;
    }
    if (local_38->m_prev_sibling == local_18) {
      memcpy(local_378,"check failed: (b.m_prev_sibling != ib)",0x27);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar7 = *(code **)(in_RDI + 0x58);
      Location::Location(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      (*pcVar7)(local_378,0x27,*(undefined8 *)(in_RDI + 0x40));
    }
    if ((local_30->m_parent == local_18) || (local_38->m_parent == local_10)) {
      if ((local_30->m_parent == local_18) && (local_38->m_parent != local_10)) {
        local_30->m_parent = local_38->m_parent;
        local_38->m_parent = local_10;
      }
      else if ((local_30->m_parent == local_18) || (local_38->m_parent != local_10)) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        handle_error(0x345f1b,(char *)0x64fd,"never reach this point");
      }
      else {
        local_38->m_parent = local_30->m_parent;
        local_30->m_parent = local_18;
      }
    }
    else {
      std::swap<unsigned_long>(&local_30->m_parent,&local_38->m_parent);
    }
  }
  return;
}

Assistant:

void Tree::_swap_hierarchy(size_t ia, size_t ib)
{
    if(ia == ib) return;

    for(size_t i = first_child(ia); i != NONE; i = next_sibling(i))
    {
        if(i == ib || i == ia)
            continue;
        _p(i)->m_parent = ib;
    }

    for(size_t i = first_child(ib); i != NONE; i = next_sibling(i))
    {
        if(i == ib || i == ia)
            continue;
        _p(i)->m_parent = ia;
    }

    auto & C4_RESTRICT a  = *_p(ia);
    auto & C4_RESTRICT b  = *_p(ib);
    auto & C4_RESTRICT pa = *_p(a.m_parent);
    auto & C4_RESTRICT pb = *_p(b.m_parent);

    if(&pa == &pb)
    {
        if((pa.m_first_child == ib && pa.m_last_child == ia)
            ||
           (pa.m_first_child == ia && pa.m_last_child == ib))
        {
            std::swap(pa.m_first_child, pa.m_last_child);
        }
        else
        {
            bool changed = false;
            if(pa.m_first_child == ia)
            {
                pa.m_first_child = ib;
                changed = true;
            }
            if(pa.m_last_child  == ia)
            {
                pa.m_last_child = ib;
                changed = true;
            }
            if(pb.m_first_child == ib && !changed)
            {
                pb.m_first_child = ia;
            }
            if(pb.m_last_child  == ib && !changed)
            {
                pb.m_last_child  = ia;
            }
        }
    }
    else
    {
        if(pa.m_first_child == ia)
            pa.m_first_child = ib;
        if(pa.m_last_child  == ia)
            pa.m_last_child  = ib;
        if(pb.m_first_child == ib)
            pb.m_first_child = ia;
        if(pb.m_last_child  == ib)
            pb.m_last_child  = ia;
    }
    std::swap(a.m_first_child , b.m_first_child);
    std::swap(a.m_last_child  , b.m_last_child);

    if(a.m_prev_sibling != ib && b.m_prev_sibling != ia &&
       a.m_next_sibling != ib && b.m_next_sibling != ia)
    {
        if(a.m_prev_sibling != NONE && a.m_prev_sibling != ib)
            _p(a.m_prev_sibling)->m_next_sibling = ib;
        if(a.m_next_sibling != NONE && a.m_next_sibling != ib)
            _p(a.m_next_sibling)->m_prev_sibling = ib;
        if(b.m_prev_sibling != NONE && b.m_prev_sibling != ia)
            _p(b.m_prev_sibling)->m_next_sibling = ia;
        if(b.m_next_sibling != NONE && b.m_next_sibling != ia)
            _p(b.m_next_sibling)->m_prev_sibling = ia;
        std::swap(a.m_prev_sibling, b.m_prev_sibling);
        std::swap(a.m_next_sibling, b.m_next_sibling);
    }
    else
    {
        if(a.m_next_sibling == ib) // n will go after m
        {
            _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling == ia);
            if(a.m_prev_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, a.m_prev_sibling != ib);
                _p(a.m_prev_sibling)->m_next_sibling = ib;
            }
            if(b.m_next_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling != ia);
                _p(b.m_next_sibling)->m_prev_sibling = ia;
            }
            size_t ns = b.m_next_sibling;
            b.m_prev_sibling = a.m_prev_sibling;
            b.m_next_sibling = ia;
            a.m_prev_sibling = ib;
            a.m_next_sibling = ns;
        }
        else if(a.m_prev_sibling == ib) // m will go after n
        {
            _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling == ia);
            if(b.m_prev_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling != ia);
                _p(b.m_prev_sibling)->m_next_sibling = ia;
            }
            if(a.m_next_sibling != NONE)
            {
                _RYML_CB_ASSERT(m_callbacks, a.m_next_sibling != ib);
                _p(a.m_next_sibling)->m_prev_sibling = ib;
            }
            size_t ns = b.m_prev_sibling;
            a.m_prev_sibling = b.m_prev_sibling;
            a.m_next_sibling = ib;
            b.m_prev_sibling = ia;
            b.m_next_sibling = ns;
        }
        else
        {
            C4_NEVER_REACH();
        }
    }
    _RYML_CB_ASSERT(m_callbacks, a.m_next_sibling != ia);
    _RYML_CB_ASSERT(m_callbacks, a.m_prev_sibling != ia);
    _RYML_CB_ASSERT(m_callbacks, b.m_next_sibling != ib);
    _RYML_CB_ASSERT(m_callbacks, b.m_prev_sibling != ib);

    if(a.m_parent != ib && b.m_parent != ia)
    {
        std::swap(a.m_parent, b.m_parent);
    }
    else
    {
        if(a.m_parent == ib && b.m_parent != ia)
        {
            a.m_parent = b.m_parent;
            b.m_parent = ia;
        }
        else if(a.m_parent != ib && b.m_parent == ia)
        {
            b.m_parent = a.m_parent;
            a.m_parent = ib;
        }
        else
        {
            C4_NEVER_REACH();
        }
    }
}